

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall glslang::TParseContext::finish(TParseContext *this)

{
  EProfile EVar1;
  TInputScanner *pTVar2;
  TIntermediate *pTVar3;
  uint uVar4;
  int iVar5;
  pointer ppTVar6;
  _func_int **pp_Var7;
  uint uVar8;
  TLayoutGeometry TVar9;
  undefined1 *puVar10;
  undefined **ppuVar11;
  undefined8 uVar12;
  TSourceLoc *pTVar13;
  char *pcVar14;
  ulong uVar15;
  
  TParseContextBase::finish(&this->super_TParseContextBase);
  if ((this->super_TParseContextBase).parsingBuiltins != false) {
    return;
  }
  ppTVar6 = (this->needsIndexLimitationChecking).
            super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
            .
            super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->needsIndexLimitationChecking).
      super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>.
      super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar6) {
    uVar15 = 0;
    do {
      constantIndexExpressionCheck(this,&ppTVar6[uVar15]->super_TIntermNode);
      uVar15 = uVar15 + 1;
      ppTVar6 = (this->needsIndexLimitationChecking).
                super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                .
                super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(this->needsIndexLimitationChecking).
                                    super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                    .
                                    super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6 >> 3)
            );
  }
  switch((this->super_TParseContextBase).super_TParseVersions.language) {
  case EShLangTessControl:
  case EShLangTessEvaluation:
    EVar1 = (this->super_TParseContextBase).super_TParseVersions.profile;
    iVar5 = (this->super_TParseContextBase).super_TParseVersions.version;
    if (iVar5 == 0x136 && EVar1 == EEsProfile) {
      pTVar2 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
      if (pTVar2->singleLogical == true) {
        pTVar13 = &pTVar2->logicalSourceLoc;
      }
      else {
        uVar8 = ~pTVar2->finale + pTVar2->numSources;
        if (pTVar2->currentSource <= (int)uVar8) {
          uVar8 = pTVar2->currentSource;
        }
        uVar4 = 0;
        if (0 < (int)uVar8) {
          uVar4 = uVar8;
        }
        pTVar13 = pTVar2->loc + uVar4;
      }
      pp_Var7 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      puVar10 = AEP_tessellation_shader;
      pcVar14 = "tessellation shaders";
      goto LAB_00430d1f;
    }
    if (iVar5 < 400 && EVar1 != EEsProfile) {
      pTVar2 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
      if (pTVar2->singleLogical == true) {
        pTVar13 = &pTVar2->logicalSourceLoc;
      }
      else {
        uVar8 = ~pTVar2->finale + pTVar2->numSources;
        if (pTVar2->currentSource <= (int)uVar8) {
          uVar8 = pTVar2->currentSource;
        }
        uVar4 = 0;
        if (0 < (int)uVar8) {
          uVar4 = uVar8;
        }
        pTVar13 = pTVar2->loc + uVar4;
      }
      pp_Var7 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      ppuVar11 = &E_GL_ARB_tessellation_shader;
      pcVar14 = "tessellation shaders";
      goto LAB_00430d99;
    }
    break;
  case EShLangGeometry:
    if (((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) &&
       ((this->super_TParseContextBase).super_TParseVersions.version == 0x136)) {
      pTVar2 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
      if (pTVar2->singleLogical == true) {
        pTVar13 = &pTVar2->logicalSourceLoc;
      }
      else {
        uVar8 = ~pTVar2->finale + pTVar2->numSources;
        if (pTVar2->currentSource <= (int)uVar8) {
          uVar8 = pTVar2->currentSource;
        }
        uVar4 = 0;
        if (0 < (int)uVar8) {
          uVar4 = uVar8;
        }
        pTVar13 = pTVar2->loc + uVar4;
      }
      pp_Var7 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      puVar10 = AEP_geometry_shader;
      pcVar14 = "geometry shaders";
      goto LAB_00430d1f;
    }
    break;
  case EShLangCompute:
    if (((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) ||
       (0x1ad < (this->super_TParseContextBase).super_TParseVersions.version)) break;
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
    if (pTVar2->singleLogical == true) {
      pTVar13 = &pTVar2->logicalSourceLoc;
    }
    else {
      uVar8 = ~pTVar2->finale + pTVar2->numSources;
      if (pTVar2->currentSource <= (int)uVar8) {
        uVar8 = pTVar2->currentSource;
      }
      uVar4 = 0;
      if (0 < (int)uVar8) {
        uVar4 = uVar8;
      }
      pTVar13 = pTVar2->loc + uVar4;
    }
    pp_Var7 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    ppuVar11 = &E_GL_ARB_compute_shader;
    pcVar14 = "compute shaders";
LAB_00430d99:
    uVar12 = 1;
    puVar10 = (undefined1 *)ppuVar11;
    goto LAB_00430da1;
  case EShLangTask:
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
    if (pTVar2->singleLogical == true) {
      pTVar13 = &pTVar2->logicalSourceLoc;
    }
    else {
      uVar8 = ~pTVar2->finale + pTVar2->numSources;
      if (pTVar2->currentSource <= (int)uVar8) {
        uVar8 = pTVar2->currentSource;
      }
      uVar4 = 0;
      if (0 < (int)uVar8) {
        uVar4 = uVar8;
      }
      pTVar13 = pTVar2->loc + uVar4;
    }
    pp_Var7 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    puVar10 = AEP_mesh_shader;
    pcVar14 = "task shaders";
    goto LAB_00430d1f;
  case EShLangMesh:
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
    if (pTVar2->singleLogical == true) {
      pTVar13 = &pTVar2->logicalSourceLoc;
    }
    else {
      uVar8 = ~pTVar2->finale + pTVar2->numSources;
      if (pTVar2->currentSource <= (int)uVar8) {
        uVar8 = pTVar2->currentSource;
      }
      uVar4 = 0;
      if (0 < (int)uVar8) {
        uVar4 = uVar8;
      }
      pTVar13 = pTVar2->loc + uVar4;
    }
    pp_Var7 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    puVar10 = AEP_mesh_shader;
    pcVar14 = "mesh shaders";
LAB_00430d1f:
    uVar12 = 2;
LAB_00430da1:
    (*pp_Var7[5])(this,pTVar13,uVar12,puVar10,pcVar14);
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangGeometry) {
    return;
  }
  iVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                    (this,"GL_NV_geometry_shader_passthrough");
  if ((char)iVar5 == '\0') {
    return;
  }
  pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  if (pTVar3->outputPrimitive == ElgNone) {
    TVar9 = pTVar3->inputPrimitive;
    if (TVar9 != ElgPoints) {
      if (TVar9 == ElgTriangles) {
        TVar9 = ElgTriangleStrip;
      }
      else {
        if (TVar9 != ElgLines) goto LAB_00430df2;
        TVar9 = ElgLineStrip;
      }
    }
    pTVar3->outputPrimitive = TVar9;
  }
LAB_00430df2:
  if (pTVar3->vertices == -1) {
    TVar9 = pTVar3->inputPrimitive;
    if (1 < TVar9 - ElgPoints) {
      if (TVar9 != ElgTriangles) {
        return;
      }
      TVar9 = ElgLinesAdjacency;
    }
    pTVar3->vertices = TVar9;
  }
  return;
}

Assistant:

void TParseContext::finish()
{
    TParseContextBase::finish();

    if (parsingBuiltins)
        return;

    // Check on array indexes for ES 2.0 (version 100) limitations.
    for (size_t i = 0; i < needsIndexLimitationChecking.size(); ++i)
        constantIndexExpressionCheck(needsIndexLimitationChecking[i]);

    // Check for stages that are enabled by extension.
    // Can't do this at the beginning, it is chicken and egg to add a stage by
    // extension.
    // Stage-specific features were correctly tested for already, this is just
    // about the stage itself.
    switch (language) {
    case EShLangGeometry:
        if (isEsProfile() && version == 310)
            requireExtensions(getCurrentLoc(), Num_AEP_geometry_shader, AEP_geometry_shader, "geometry shaders");
        break;
    case EShLangTessControl:
    case EShLangTessEvaluation:
        if (isEsProfile() && version == 310)
            requireExtensions(getCurrentLoc(), Num_AEP_tessellation_shader, AEP_tessellation_shader, "tessellation shaders");
        else if (!isEsProfile() && version < 400)
            requireExtensions(getCurrentLoc(), 1, &E_GL_ARB_tessellation_shader, "tessellation shaders");
        break;
    case EShLangCompute:
        if (!isEsProfile() && version < 430)
            requireExtensions(getCurrentLoc(), 1, &E_GL_ARB_compute_shader, "compute shaders");
        break;
    case EShLangTask:
        requireExtensions(getCurrentLoc(), Num_AEP_mesh_shader, AEP_mesh_shader, "task shaders");
        break;
    case EShLangMesh:
        requireExtensions(getCurrentLoc(), Num_AEP_mesh_shader, AEP_mesh_shader, "mesh shaders");
        break;
    default:
        break;
    }

    // Set default outputs for GL_NV_geometry_shader_passthrough
    if (language == EShLangGeometry && extensionTurnedOn(E_SPV_NV_geometry_shader_passthrough)) {
        if (intermediate.getOutputPrimitive() == ElgNone) {
            switch (intermediate.getInputPrimitive()) {
            case ElgPoints:      intermediate.setOutputPrimitive(ElgPoints);    break;
            case ElgLines:       intermediate.setOutputPrimitive(ElgLineStrip); break;
            case ElgTriangles:   intermediate.setOutputPrimitive(ElgTriangleStrip); break;
            default: break;
            }
        }
        if (intermediate.getVertices() == TQualifier::layoutNotSet) {
            switch (intermediate.getInputPrimitive()) {
            case ElgPoints:      intermediate.setVertices(1); break;
            case ElgLines:       intermediate.setVertices(2); break;
            case ElgTriangles:   intermediate.setVertices(3); break;
            default: break;
            }
        }
    }
}